

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void change_inline_insn_regs(MIR_context_t ctx,MIR_insn_t_conflict new_insn)

{
  char cVar1;
  MIR_reg_t MVar2;
  size_t sVar3;
  size_t actual_nops;
  size_t i;
  MIR_insn_t_conflict new_insn_local;
  MIR_context_t ctx_local;
  
  sVar3 = MIR_insn_nops(ctx,new_insn);
  for (actual_nops = 0; actual_nops < sVar3; actual_nops = actual_nops + 1) {
    cVar1 = new_insn->ops[actual_nops].field_0x8;
    if (cVar1 == '\x01') {
      MVar2 = VARR_MIR_reg_tget(ctx->simplify_ctx->inline_reg_map,
                                (ulong)new_insn->ops[actual_nops].u.reg);
      new_insn->ops[actual_nops].u.reg = MVar2;
    }
    else if (cVar1 == '\n') {
      if (new_insn->ops[actual_nops].u.mem.base != 0) {
        MVar2 = VARR_MIR_reg_tget(ctx->simplify_ctx->inline_reg_map,
                                  (ulong)new_insn->ops[actual_nops].u.mem.base);
        new_insn->ops[actual_nops].u.mem.base = MVar2;
      }
      if (new_insn->ops[actual_nops].u.mem.index != 0) {
        MVar2 = VARR_MIR_reg_tget(ctx->simplify_ctx->inline_reg_map,
                                  (ulong)new_insn->ops[actual_nops].u.mem.index);
        new_insn->ops[actual_nops].u.mem.index = MVar2;
      }
    }
  }
  return;
}

Assistant:

static void change_inline_insn_regs (MIR_context_t ctx, MIR_insn_t new_insn) {
  size_t i, actual_nops;
  actual_nops = MIR_insn_nops (ctx, new_insn);
  for (i = 0; i < actual_nops; i++) {
    switch (new_insn->ops[i].mode) {
    case MIR_OP_REG:
      new_insn->ops[i].u.reg = VARR_GET (MIR_reg_t, inline_reg_map, new_insn->ops[i].u.reg);
      break;
    case MIR_OP_MEM:
      if (new_insn->ops[i].u.mem.base != 0)
        new_insn->ops[i].u.mem.base
          = VARR_GET (MIR_reg_t, inline_reg_map, new_insn->ops[i].u.mem.base);
      if (new_insn->ops[i].u.mem.index != 0)
        new_insn->ops[i].u.mem.index
          = VARR_GET (MIR_reg_t, inline_reg_map, new_insn->ops[i].u.mem.index);
      break;
    default: /* do nothing */ break;
    }
  }
}